

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O2

void emit_eobrun(phuff_entropy_ptr entropy)

{
  j_compress_ptr pjVar1;
  jpeg_error_mgr *pjVar2;
  int size;
  
  if ((long)(int)entropy->EOBRUN != 0) {
    size = ""[(int)entropy->EOBRUN] - 1;
    if (0xf < ""[(int)entropy->EOBRUN]) {
      pjVar1 = entropy->cinfo;
      pjVar2 = pjVar1->err;
      pjVar2->msg_code = 0x28;
      (*pjVar2->error_exit)((j_common_ptr)pjVar1);
    }
    emit_symbol(entropy,entropy->ac_tbl_no,size * 0x10);
    if (size != 0) {
      emit_bits(entropy,entropy->EOBRUN,size);
    }
    entropy->EOBRUN = 0;
    emit_buffered_bits(entropy,entropy->bit_buffer,entropy->BE);
    entropy->BE = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_eobrun(phuff_entropy_ptr entropy)
{
  register int temp, nbits;

  if (entropy->EOBRUN > 0) {    /* if there is any pending EOBRUN */
    temp = entropy->EOBRUN;
    nbits = JPEG_NBITS_NONZERO(temp) - 1;
    /* safety check: shouldn't happen given limited correction-bit buffer */
    if (nbits > 14)
      ERREXIT(entropy->cinfo, JERR_HUFF_MISSING_CODE);

    emit_symbol(entropy, entropy->ac_tbl_no, nbits << 4);
    if (nbits)
      emit_bits(entropy, entropy->EOBRUN, nbits);

    entropy->EOBRUN = 0;

    /* Emit any buffered correction bits */
    emit_buffered_bits(entropy, entropy->bit_buffer, entropy->BE);
    entropy->BE = 0;
  }
}